

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeDrawList(ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImDrawVert *pIVar3;
  ImGuiTable *table;
  ImGuiContext *pIVar4;
  unsigned_short *puVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ImGuiWindow *window_1;
  ImDrawList *this;
  long lVar9;
  bool show_mesh;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  ImVec4 *buf_00;
  int iVar13;
  long lVar14;
  ImDrawCmd *pIVar15;
  ulong uVar16;
  undefined4 uVar17;
  float fVar18;
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char buf [300];
  ImGuiListClipper local_1e8;
  ImGuiContext *local_1c0;
  ImDrawCmd *local_1b8;
  unsigned_short *local_1b0;
  ImDrawList *local_1a8;
  long local_1a0;
  ulong local_198;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  iVar13 = (draw_list->CmdBuffer).Size;
  lVar14 = (long)iVar13;
  if ((0 < lVar14) && (pIVar15 = (draw_list->CmdBuffer).Data, pIVar15[lVar14 + -1].ElemCount == 0))
  {
    iVar13 = iVar13 - (uint)(pIVar15[lVar14 + -1].UserCallback == (ImDrawCallback)0x0);
  }
  local_1c0 = GImGui;
  pcVar10 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar10 = draw_list->_OwnerName;
  }
  bVar6 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar10,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar13);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar6) {
      return;
    }
  }
  else {
    this = GetViewportDrawList(*(pIVar4->Viewports).Data,1,"##Foreground");
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar6) {
        return;
      }
    }
    else {
      bVar7 = IsItemHovered(0);
      if (bVar7) {
        local_168[0].y = (window->Size).y + (window->Pos).y;
        local_168[0].x = (window->Size).x + (window->Pos).x;
        ImDrawList::AddRect(this,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
      }
      if (!bVar6) {
        return;
      }
      if (window->WasActive == false) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
    }
    if (0 < iVar13) {
      pIVar15 = (draw_list->CmdBuffer).Data;
      local_1a0 = (long)iVar13 * 0x38;
      local_1a8 = draw_list;
      do {
        if (pIVar15->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString((char *)local_168,300,
                         "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         SUB84((double)(pIVar15->ClipRect).x,0),
                         SUB84((double)(pIVar15->ClipRect).y,0),(double)(pIVar15->ClipRect).z,
                         (double)(pIVar15->ClipRect).w,(ulong)pIVar15->ElemCount / 3,
                         pIVar15->TextureId);
          bVar6 = TreeNode((void *)(((long)pIVar15 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                   0x6db6db6db6db6db7),"%s",local_168);
          bVar7 = IsItemHovered(0);
          if (bVar7) {
            if ((local_1c0->DebugMetricsConfig).ShowDrawCmdMesh == false) {
              if ((this != (ImDrawList *)0x0) &&
                 ((local_1c0->DebugMetricsConfig).ShowDrawCmdBoundingBoxes != false)) {
                show_mesh = false;
                bVar7 = true;
                goto LAB_00129269;
              }
            }
            else if (this != (ImDrawList *)0x0) {
              bVar7 = (local_1c0->DebugMetricsConfig).ShowDrawCmdBoundingBoxes;
              show_mesh = true;
LAB_00129269:
              DebugNodeDrawCmdShowMeshAndBoundingBox(this,draw_list,pIVar15,show_mesh,bVar7);
            }
          }
          if (bVar6) {
            if ((draw_list->IdxBuffer).Size < 1) {
              local_1b0 = (unsigned_short *)0x0;
            }
            else {
              local_1b0 = (draw_list->IdxBuffer).Data;
            }
            uVar1 = pIVar15->VtxOffset;
            uVar11 = pIVar15->IdxOffset;
            pIVar3 = (draw_list->VtxBuffer).Data;
            uVar8 = pIVar15->ElemCount + uVar11;
            uVar17 = 0;
            if (uVar11 < uVar8) {
              fVar18 = 0.0;
              do {
                local_1e8.DisplayStart = 0;
                local_1e8.DisplayEnd = 0;
                local_1e8.ItemsCount = 0;
                local_1e8.StepNo = 0;
                local_1e8.ItemsFrozen = 0;
                local_1e8.ItemsHeight = 0.0;
                lVar14 = 0;
                do {
                  uVar12 = (uint)((ulong)uVar11 + lVar14);
                  if (local_1b0 != (unsigned_short *)0x0) {
                    uVar12 = (uint)local_1b0[(ulong)uVar11 + lVar14 & 0xffffffff];
                  }
                  *(ImVec2 *)(&local_1e8.DisplayStart + lVar14 * 2) =
                       pIVar3[(ulong)uVar1 + (ulong)uVar12].pos;
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                fVar18 = fVar18 + ABS(((float)local_1e8.DisplayEnd - (float)local_1e8.StepNo) *
                                      (float)local_1e8.ItemsFrozen +
                                      ((float)local_1e8.StepNo - local_1e8.ItemsHeight) *
                                      (float)local_1e8.DisplayStart +
                                      (local_1e8.ItemsHeight - (float)local_1e8.DisplayEnd) *
                                      (float)local_1e8.ItemsCount) * 0.5;
                uVar11 = uVar11 + 3;
              } while (uVar11 < uVar8);
              uVar17 = SUB84((double)fVar18,0);
            }
            ImFormatString((char *)local_168,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           uVar17);
            local_1e8.DisplayStart = 0;
            local_1e8.DisplayEnd = 0;
            Selectable((char *)local_168,false,0,(ImVec2 *)&local_1e8);
            bVar6 = IsItemHovered(0);
            if (this != (ImDrawList *)0x0 && bVar6) {
              DebugNodeDrawCmdShowMeshAndBoundingBox(this,draw_list,pIVar15,true,false);
            }
            ImGuiListClipper::ImGuiListClipper(&local_1e8);
            uVar11 = pIVar15->ElemCount;
            pIVar2 = GImGui->CurrentWindow;
            table = GImGui->CurrentTable;
            local_1b8 = pIVar15;
            if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
              TableEndRow(table);
            }
            local_1e8.StartPosY = (pIVar2->DC).CursorPos.y;
            local_1e8.ItemsHeight = -1.0;
            local_1e8.ItemsCount = uVar11 / 3;
            local_1e8.StepNo = 0;
            local_1e8.ItemsFrozen = 0;
            local_1e8.DisplayStart = -1;
            local_1e8.DisplayEnd = 0;
            while (bVar6 = ImGuiListClipper::Step(&local_1e8), bVar6) {
              if (local_1e8.DisplayStart < local_1e8.DisplayEnd) {
                uVar16 = (ulong)(local_1e8.DisplayStart * 3 + local_1b8->IdxOffset);
                uVar11 = local_1e8.DisplayStart;
                do {
                  puVar5 = local_1b0;
                  local_198 = (ulong)uVar11;
                  local_188[0].x = 0.0;
                  local_188[0].y = 0.0;
                  local_188[1].x = 0.0;
                  local_188[1].y = 0.0;
                  local_188[2].x = 0.0;
                  local_188[2].y = 0.0;
                  lVar14 = 0;
                  buf_00 = local_168;
                  do {
                    if (local_1b0 == (unsigned_short *)0x0) {
                      uVar11 = (int)uVar16 + (int)lVar14;
                    }
                    else {
                      uVar11 = (uint)puVar5[(int)uVar16 + lVar14];
                    }
                    lVar9 = (long)(int)uVar11;
                    local_188[lVar14] = pIVar3[(ulong)uVar1 + lVar9].pos;
                    pcVar10 = "     ";
                    if (lVar14 == 0) {
                      pcVar10 = "Vert:";
                    }
                    iVar13 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                            "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                            ,SUB84((double)pIVar3[(ulong)uVar1 + lVar9].pos.x,0),
                                            SUB84((double)pIVar3[(ulong)uVar1 + lVar9].pos.y,0),
                                            (double)pIVar3[(ulong)uVar1 + lVar9].uv.x,
                                            (double)pIVar3[(ulong)uVar1 + lVar9].uv.y,pcVar10,
                                            (uVar16 & 0xffffffff) + lVar14,
                                            (ulong)pIVar3[(ulong)uVar1 + lVar9].col);
                    buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar13);
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 3);
                  local_190.x = 0.0;
                  local_190.y = 0.0;
                  Selectable((char *)local_168,false,0,&local_190);
                  if ((this != (ImDrawList *)0x0) && (bVar6 = IsItemHovered(0), bVar6)) {
                    uVar11 = this->Flags;
                    this->Flags = uVar11 & 0xfffffffe;
                    ImDrawList::AddPolyline(this,local_188,3,0xff00ffff,true,1.0);
                    this->Flags = uVar11;
                  }
                  uVar16 = (uVar16 & 0xffffffff) + 3;
                  uVar11 = (int)local_198 + 1;
                } while ((int)uVar11 < local_1e8.DisplayEnd);
              }
            }
            TreePop();
            ImGuiListClipper::~ImGuiListClipper(&local_1e8);
            pIVar15 = local_1b8;
            draw_list = local_1a8;
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar15->UserCallback,pIVar15->UserCallbackData);
        }
        pIVar15 = pIVar15 + 1;
      } while (pIVar15 < (ImDrawCmd *)
                         ((long)&(((draw_list->CmdBuffer).Data)->ClipRect).x + local_1a0));
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered())
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}